

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_c_function_data_call
                  (JSContext *ctx,JSValue func_obj,JSValue this_val,int argc,JSValue *argv,int flags
                  )

{
  byte bVar1;
  undefined2 uVar2;
  code *pcVar3;
  long lVar4;
  int64_t *piVar5;
  JSValue *__dest;
  JSValue *pJVar6;
  int64_t iVar7;
  undefined8 *puVar8;
  JSValue JVar9;
  undefined8 uStack_50;
  JSValue JStack_48;
  JSValue *local_38;
  
  iVar7 = this_val.tag;
  __dest = &JStack_48;
  if (((int)func_obj.tag == -1) && (*(short *)((long)func_obj.u.ptr + 6) == 0xf)) {
    puVar8 = *(undefined8 **)((long)func_obj.u.ptr + 0x30);
  }
  else {
    puVar8 = (undefined8 *)0x0;
  }
  bVar1 = *(byte *)(puVar8 + 1);
  pJVar6 = argv;
  if (argc < (int)(uint)bVar1) {
    __dest = &JStack_48 + -(ulong)bVar1;
    pJVar6 = __dest;
    if (0 < argc) {
      JStack_48.tag = iVar7;
      local_38 = __dest;
      (&uStack_50)[(ulong)bVar1 * -2] = 0x116bae;
      memcpy(__dest,argv,(ulong)(uint)argc << 4);
      pJVar6 = local_38;
      iVar7 = JStack_48.tag;
    }
    lVar4 = (long)argc;
    piVar5 = &pJVar6[lVar4].tag;
    do {
      (((JSValue *)(piVar5 + -1))->u).int32 = 0;
      *piVar5 = 3;
      lVar4 = lVar4 + 1;
      piVar5 = piVar5 + 2;
    } while (lVar4 < (long)(ulong)bVar1);
  }
  uVar2 = *(undefined2 *)((long)puVar8 + 10);
  __dest[-1].u.ptr = puVar8 + 2;
  pcVar3 = (code *)*puVar8;
  __dest[-2].tag = 0x116b72;
  JVar9 = (JSValue)(*pcVar3)(ctx,this_val.u.float64,iVar7,(ulong)(uint)argc,pJVar6,uVar2);
  return JVar9;
}

Assistant:

static JSValue js_c_function_data_call(JSContext *ctx, JSValueConst func_obj,
                                       JSValueConst this_val,
                                       int argc, JSValueConst *argv, int flags)
{
    JSCFunctionDataRecord *s = JS_GetOpaque(func_obj, JS_CLASS_C_FUNCTION_DATA);
    JSValueConst *arg_buf;
    int i;

    /* XXX: could add the function on the stack for debug */
    if (unlikely(argc < s->length)) {
        arg_buf = alloca(sizeof(arg_buf[0]) * s->length);
        for(i = 0; i < argc; i++)
            arg_buf[i] = argv[i];
        for(i = argc; i < s->length; i++)
            arg_buf[i] = JS_UNDEFINED;
    } else {
        arg_buf = argv;
    }

    return s->func(ctx, this_val, argc, arg_buf, s->magic, s->data);
}